

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

size_t __thiscall CoreML::Specification::FloatVector::ByteSizeLong(FloatVector *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  
  uVar1 = (ulong)(uint)(this->vector_).current_size_;
  if (uVar1 == 0) {
    lVar3 = 0;
  }
  else {
    uVar2 = ((long)(uVar1 << 0x22) >> 0x20) + 1;
    lVar3 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    lVar3 = (ulong)((int)lVar3 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = lVar3 + uVar1 * 4;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar1 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

inline int RepeatedField<Element>::size() const {
  return current_size_;
}